

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

int ReadHuffmanCodesHelper
              (int color_cache_bits,int num_htree_groups,int num_htree_groups_max,int *mapping,
              VP8LDecoder *dec,HuffmanTables *huffman_tables,HTreeGroup **htree_groups)

{
  HuffmanCode **ppHVar1;
  ushort uVar2;
  HuffmanCode HVar3;
  HTreeGroup *pHVar4;
  HuffmanCode *pHVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  HTreeGroup *pHVar10;
  byte bVar11;
  ulong uVar12;
  int *code_lengths;
  uint uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  
  iVar6 = 1 << ((byte)color_cache_bits & 0x1f);
  code_lengths = (int *)0x0;
  if ((num_htree_groups <= num_htree_groups_max) &&
     (num_htree_groups == num_htree_groups_max || mapping != (int *)0x0)) {
    uVar2 = kTableSize[color_cache_bits];
    iVar7 = iVar6 + 0x118;
    if (color_cache_bits < 1) {
      iVar7 = 0x118;
    }
    code_lengths = (int *)WebPSafeCalloc((long)iVar7,4);
    pHVar10 = VP8LHtreeGroupsNew(num_htree_groups);
    *htree_groups = pHVar10;
    if (((pHVar10 != (HTreeGroup *)0x0) && (code_lengths != (int *)0x0)) &&
       (iVar7 = VP8LHuffmanTablesAllocate((uint)uVar2 * num_htree_groups,huffman_tables), iVar7 != 0
       )) {
      if (0 < num_htree_groups_max) {
        uVar12 = 0;
        do {
          if (mapping == (int *)0x0) {
            iVar7 = (int)uVar12;
LAB_0010ce2a:
            pHVar4 = *htree_groups;
            pHVar10 = pHVar4 + iVar7;
            uVar9 = 1;
            uVar18 = 0;
            iVar15 = 0;
            iVar16 = 0;
            do {
              iVar8 = 0;
              if (uVar18 == 0) {
                iVar8 = iVar6;
              }
              if (color_cache_bits < 1) {
                iVar8 = 0;
              }
              uVar13 = iVar8 + (uint)kAlphabetSize[uVar18];
              iVar8 = ReadHuffmanCode(uVar13,dec,code_lengths,huffman_tables);
              pHVar5 = huffman_tables->curr_segment->curr_table;
              pHVar10->htrees[uVar18] = pHVar5;
              if (iVar8 == 0) goto LAB_0010d0f6;
              if (uVar9 == 0) {
                bVar11 = pHVar5->bits;
                uVar9 = 0;
              }
              else {
                bVar11 = pHVar5->bits;
                if ((uVar18 & 3) == 0) {
                  uVar9 = 1;
                }
                else {
                  uVar9 = (uint)(bVar11 == 0);
                }
              }
              iVar16 = iVar16 + (uint)bVar11;
              ppHVar1 = &huffman_tables->curr_segment->curr_table;
              *ppHVar1 = *ppHVar1 + iVar8;
              if (uVar18 == 4) break;
              iVar8 = *code_lengths;
              if (1 < (int)uVar13) {
                uVar17 = 1;
                do {
                  if (iVar8 < code_lengths[uVar17]) {
                    iVar8 = code_lengths[uVar17];
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar13 != uVar17);
              }
              iVar15 = iVar15 + iVar8;
              uVar18 = uVar18 + 1;
            } while (uVar18 != 5);
            pHVar10->is_trivial_literal = uVar9;
            pHVar10->is_trivial_code = 0;
            if (uVar9 != 0) {
              uVar9 = CONCAT22(pHVar10->htrees[1]->value,pHVar10->htrees[2]->value) |
                      (uint)pHVar10->htrees[3]->value << 0x18;
              pHVar10->literal_arb = uVar9;
              if ((iVar16 == 0) && (uVar2 = pHVar10->htrees[0]->value, uVar2 < 0x100)) {
                pHVar10->is_trivial_code = 1;
                pHVar10->use_packed_table = 0;
                pHVar10->literal_arb = uVar9 | (uint)uVar2 << 8;
                goto LAB_0010d0a3;
              }
            }
            pHVar10->use_packed_table = (uint)(iVar15 < 6);
            if (iVar15 < 6) {
              pHVar5 = pHVar10->htrees[0];
              lVar14 = 0;
              do {
                bVar11 = pHVar5[lVar14].bits;
                uVar2 = pHVar5[lVar14].value;
                if (uVar2 < 0x100) {
                  pHVar4[iVar7].packed_table[lVar14].bits = (uint)bVar11;
                  uVar9 = (uint)lVar14 >> (bVar11 & 0x1f);
                  pHVar4[iVar7].packed_table[lVar14].value = (uint)uVar2 << 8;
                  HVar3 = pHVar10->htrees[1][uVar9];
                  iVar15 = ((uint)HVar3 & 0xff) + (uint)bVar11;
                  pHVar4[iVar7].packed_table[lVar14].bits = iVar15;
                  uVar13 = (uint)HVar3 & 0xffff0000 | (uint)uVar2 << 8;
                  pHVar4[iVar7].packed_table[lVar14].value = uVar13;
                  uVar9 = uVar9 >> (HVar3.bits & 0x1f);
                  HVar3 = pHVar10->htrees[2][uVar9];
                  iVar15 = ((uint)HVar3 & 0xff) + iVar15;
                  pHVar4[iVar7].packed_table[lVar14].bits = iVar15;
                  uVar13 = (uint)HVar3 >> 0x10 | uVar13;
                  pHVar4[iVar7].packed_table[lVar14].value = uVar13;
                  HVar3 = pHVar10->htrees[3][uVar9 >> (HVar3.bits & 0x1f)];
                  pHVar4[iVar7].packed_table[lVar14].bits = ((uint)HVar3 & 0xff) + iVar15;
                  pHVar4[iVar7].packed_table[lVar14].value = ((uint)HVar3 & 0xff0000) << 8 | uVar13;
                }
                else {
                  pHVar4[iVar7].packed_table[lVar14].bits = bVar11 | 0x100;
                  pHVar4[iVar7].packed_table[lVar14].value = (uint)uVar2;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0x40);
            }
          }
          else {
            iVar7 = mapping[uVar12];
            if (iVar7 != -1) goto LAB_0010ce2a;
            lVar14 = 0;
            do {
              iVar7 = 0;
              if (lVar14 == 0) {
                iVar7 = iVar6;
              }
              if (color_cache_bits < 1) {
                iVar7 = 0;
              }
              iVar7 = ReadHuffmanCode(iVar7 + (uint)*(ushort *)((long)kAlphabetSize + lVar14),dec,
                                      code_lengths,(HuffmanTables *)0x0);
              if (iVar7 == 0) goto LAB_0010d0f6;
              lVar14 = lVar14 + 2;
            } while (lVar14 != 10);
          }
LAB_0010d0a3:
          uVar12 = uVar12 + 1;
        } while (uVar12 != (uint)num_htree_groups_max);
      }
      WebPSafeFree(code_lengths);
      return 1;
    }
    if ((dec->status_ == VP8_STATUS_SUSPENDED) || (dec->status_ == VP8_STATUS_OK)) {
      dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
    }
  }
LAB_0010d0f6:
  WebPSafeFree(code_lengths);
  VP8LHuffmanTablesDeallocate(huffman_tables);
  VP8LHtreeGroupsFree(*htree_groups);
  *htree_groups = (HTreeGroup *)0x0;
  return 0;
}

Assistant:

int ReadHuffmanCodesHelper(int color_cache_bits, int num_htree_groups,
                           int num_htree_groups_max, const int* const mapping,
                           VP8LDecoder* const dec,
                           HuffmanTables* const huffman_tables,
                           HTreeGroup** const htree_groups) {
  int i, j, ok = 0;
  const int max_alphabet_size =
      kAlphabetSize[0] + ((color_cache_bits > 0) ? 1 << color_cache_bits : 0);
  const int table_size = kTableSize[color_cache_bits];
  int* code_lengths = NULL;

  if ((mapping == NULL && num_htree_groups != num_htree_groups_max) ||
      num_htree_groups > num_htree_groups_max) {
    goto Error;
  }

  code_lengths =
      (int*)WebPSafeCalloc((uint64_t)max_alphabet_size, sizeof(*code_lengths));
  *htree_groups = VP8LHtreeGroupsNew(num_htree_groups);

  if (*htree_groups == NULL || code_lengths == NULL ||
      !VP8LHuffmanTablesAllocate(num_htree_groups * table_size,
                                 huffman_tables)) {
    VP8LSetError(dec, VP8_STATUS_OUT_OF_MEMORY);
    goto Error;
  }

  for (i = 0; i < num_htree_groups_max; ++i) {
    // If the index "i" is unused in the Huffman image, just make sure the
    // coefficients are valid but do not store them.
    if (mapping != NULL && mapping[i] == -1) {
      for (j = 0; j < HUFFMAN_CODES_PER_META_CODE; ++j) {
        int alphabet_size = kAlphabetSize[j];
        if (j == 0 && color_cache_bits > 0) {
          alphabet_size += (1 << color_cache_bits);
        }
        // Passing in NULL so that nothing gets filled.
        if (!ReadHuffmanCode(alphabet_size, dec, code_lengths, NULL)) {
          goto Error;
        }
      }
    } else {
      HTreeGroup* const htree_group =
          &(*htree_groups)[(mapping == NULL) ? i : mapping[i]];
      HuffmanCode** const htrees = htree_group->htrees;
      int size;
      int total_size = 0;
      int is_trivial_literal = 1;
      int max_bits = 0;
      for (j = 0; j < HUFFMAN_CODES_PER_META_CODE; ++j) {
        int alphabet_size = kAlphabetSize[j];
        if (j == 0 && color_cache_bits > 0) {
          alphabet_size += (1 << color_cache_bits);
        }
        size =
            ReadHuffmanCode(alphabet_size, dec, code_lengths, huffman_tables);
        htrees[j] = huffman_tables->curr_segment->curr_table;
        if (size == 0) {
          goto Error;
        }
        if (is_trivial_literal && kLiteralMap[j] == 1) {
          is_trivial_literal = (htrees[j]->bits == 0);
        }
        total_size += htrees[j]->bits;
        huffman_tables->curr_segment->curr_table += size;
        if (j <= ALPHA) {
          int local_max_bits = code_lengths[0];
          int k;
          for (k = 1; k < alphabet_size; ++k) {
            if (code_lengths[k] > local_max_bits) {
              local_max_bits = code_lengths[k];
            }
          }
          max_bits += local_max_bits;
        }
      }
      htree_group->is_trivial_literal = is_trivial_literal;
      htree_group->is_trivial_code = 0;
      if (is_trivial_literal) {
        const int red = htrees[RED][0].value;
        const int blue = htrees[BLUE][0].value;
        const int alpha = htrees[ALPHA][0].value;
        htree_group->literal_arb = ((uint32_t)alpha << 24) | (red << 16) | blue;
        if (total_size == 0 && htrees[GREEN][0].value < NUM_LITERAL_CODES) {
          htree_group->is_trivial_code = 1;
          htree_group->literal_arb |= htrees[GREEN][0].value << 8;
        }
      }
      htree_group->use_packed_table =
          !htree_group->is_trivial_code && (max_bits < HUFFMAN_PACKED_BITS);
      if (htree_group->use_packed_table) BuildPackedTable(htree_group);
    }
  }
  ok = 1;

 Error:
  WebPSafeFree(code_lengths);
  if (!ok) {
    VP8LHuffmanTablesDeallocate(huffman_tables);
    VP8LHtreeGroupsFree(*htree_groups);
    *htree_groups = NULL;
  }
  return ok;
}